

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9CFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  Gia_Man_t *pNew;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Ssc_Pars_t Pars;
  Ssc_Pars_t local_54;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Ssc_ManSetDefaultParams(&local_54);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"WCacvh"), pAbc_00 = local_38,
          iVar6 = globalUtilOptind, 0x60 < iVar1) {
      piVar3 = &local_54.fAppend;
      if ((iVar1 != 0x61) && (piVar3 = &local_54.fVerify, iVar1 != 99)) {
        if (iVar1 != 0x76) goto LAB_0028050e;
        piVar3 = &local_54.fVerbose;
      }
      *(byte *)piVar3 = (byte)*piVar3 ^ 1;
    }
    if (iVar1 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00280502:
        Abc_Print(-1,pcVar4);
        break;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_54.nBTLimit = uVar2;
    }
    else {
      if (iVar1 != 0x57) {
        if (iVar1 == -1) {
          if (local_38->pGia != (Gia_Man_t *)0x0) {
            pNew = Ssc_PerformSweepingConstr(local_38->pGia,&local_54);
            Abc_FrameUpdateGia(pAbc_00,pNew);
            return 0;
          }
          pcVar4 = "Abc_CommandAbc9CFraig(): There is no AIG.\n";
          iVar6 = -1;
          goto LAB_002805ff;
        }
        break;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_00280502;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_54.nWords = uVar2;
    }
    globalUtilOptind = iVar6 + 1;
  } while (-1 < (int)uVar2);
LAB_0028050e:
  Abc_Print(-2,"usage: &cfraig [-WC <num>] [-acvh]\n");
  Abc_Print(-2,"\t         performs combinational SAT sweeping under constraints\n");
  Abc_Print(-2,"\t         which are present in the AIG or set manually using \"constr\"\n");
  Abc_Print(-2,"\t         (constraints are listed as last POs and true when they are 0)\n");
  Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",
            (ulong)(uint)local_54.nWords);
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)(uint)local_54.nBTLimit);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_54.fAppend == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-a     : toggle appending constraints to the result [default = %s]\n",pcVar4);
  pcVar4 = "yes";
  if (local_54.fVerify == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle performing internal verification [default = %s]\n",pcVar4);
  if (local_54.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar6 = -2;
LAB_002805ff:
  Abc_Print(iVar6,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9CFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    Ssc_Pars_t Pars, * pPars = &Pars;
    Ssc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCacvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAppend ^= 1;
            break;
        case 'c':
            pPars->fVerify ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9CFraig(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Ssc_PerformSweepingConstr( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cfraig [-WC <num>] [-acvh]\n" );
    Abc_Print( -2, "\t         performs combinational SAT sweeping under constraints\n" );
    Abc_Print( -2, "\t         which are present in the AIG or set manually using \"constr\"\n" );
    Abc_Print( -2, "\t         (constraints are listed as last POs and true when they are 0)\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-a     : toggle appending constraints to the result [default = %s]\n", pPars->fAppend? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle performing internal verification [default = %s]\n", pPars->fVerify? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}